

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 internalFormat;
  deUint32 minFilter_00;
  Context *context;
  int extraout_EAX;
  Texture2DRenderCase *this_00;
  char *pcVar1;
  Mat3 *local_218;
  deUint32 local_1cc;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string name;
  bool minify;
  int numTextures;
  deUint32 wrapT;
  deUint32 wrapS;
  deUint32 magFilter;
  deUint32 minFilter;
  deUint32 format;
  int formatNdx;
  int caseNdx;
  Matrix<float,_3,_3> local_120;
  Vector<float,_2> local_fc;
  Matrix<float,_3,_3> local_f4;
  undefined1 local_d0 [8];
  Mat3 magTransform;
  Vector<float,_3> local_a0;
  Matrix<float,_3,_3> local_94;
  Vector<float,_2> local_70;
  Matrix<float,_3,_3> local_68;
  undefined1 local_44 [8];
  Mat3 minTransform;
  TextureFilteringTests *this_local;
  
  minTransform.m_data.m_data[2].m_data._4_8_ = this;
  tcu::Vector<float,_2>::Vector(&local_70,-0.3,-0.6);
  tcu::translationMatrix<float,_2>(&local_68,&local_70);
  tcu::Vector<float,_3>::Vector(&local_a0,1.7,2.3,1.0);
  tcu::Matrix<float,_3,_3>::Matrix(&local_94,&local_a0);
  tcu::operator*((Matrix<float,_3,_3> *)local_44,&local_68,&local_94);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_94);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_68);
  tcu::Vector<float,_2>::Vector(&local_fc,0.3,0.4);
  tcu::translationMatrix<float,_2>(&local_f4,&local_fc);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&formatNdx,0.3,0.2,1.0);
  tcu::Matrix<float,_3,_3>::Matrix(&local_120,(Vector<float,_3> *)&formatNdx);
  tcu::operator*((Matrix<float,_3,_3> *)local_d0,&local_f4,&local_120);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_120);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_f4);
  for (format = 0; (int)format < 8; format = format + 1) {
    for (minFilter = 0; (int)minFilter < 4; minFilter = minFilter + 1) {
      internalFormat = init::texFormats[(int)minFilter].internalFormat;
      minFilter_00 = init::cases[(int)format].filter;
      local_1cc = minFilter_00;
      if ((minFilter_00 != 0x2600) && (minFilter_00 != 0x2601)) {
        local_1cc = 0x2601;
      }
      name.field_2._12_4_ = 1;
      name.field_2._M_local_buf[0xb] = init::cases[(int)format].minify & 1;
      pcVar1 = init::cases[(int)format].name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,pcVar1,&local_1b1);
      pcVar1 = "_magnify_";
      if ((name.field_2._M_local_buf[0xb] & 1U) != 0) {
        pcVar1 = "_minify_";
      }
      std::operator+(&local_190,&local_1b0,pcVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     &local_190,init::texFormats[(int)minFilter].name);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      this_00 = (Texture2DRenderCase *)operator_new(0x218);
      context = (this->super_TestCaseGroup).m_context;
      pcVar1 = (char *)std::__cxx11::string::c_str();
      if ((name.field_2._M_local_buf[0xb] & 1U) == 0) {
        local_218 = (Mat3 *)local_d0;
      }
      else {
        local_218 = (Mat3 *)local_44;
      }
      Texture2DRenderCase::Texture2DRenderCase
                (this_00,context,pcVar1,"",internalFormat,0x2901,0x2901,minFilter_00,local_1cc,
                 local_218,name.field_2._12_4_,true);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)local_170);
    }
  }
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_d0);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_44);
  return extraout_EAX;
}

Assistant:

void TextureFilteringTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} texFormats[] =
	{
		{ "rgb565",		GL_RGB565	},
		{ "rgba8",		GL_RGBA8	},
		{ "rg16f",		GL_RG16F	},
		{ "rgba16f",	GL_RGBA16F	}
	};
	static const struct
	{
		const char*	name;
		deUint32	filter;
		bool		minify;
	} cases[] =
	{
		{ "nearest",				GL_NEAREST,					true	},
		{ "nearest",				GL_NEAREST,					false	},
		{ "linear",					GL_LINEAR,					true	},
		{ "linear",					GL_LINEAR,					false	},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST,	true	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR,	true	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST,	true	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR,	true	}
	};

	tcu::Mat3 minTransform	= tcu::translationMatrix(tcu::Vec2(-0.3f, -0.6f)) * tcu::Mat3(tcu::Vec3(1.7f, 2.3f, 1.0f));
	tcu::Mat3 magTransform	= tcu::translationMatrix(tcu::Vec2( 0.3f,  0.4f)) * tcu::Mat3(tcu::Vec3(0.3f, 0.2f, 1.0f));

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
		{
			deUint32	format		= texFormats[formatNdx].internalFormat;
			deUint32	minFilter	= cases[caseNdx].filter;
			deUint32	magFilter	= (minFilter == GL_NEAREST || minFilter == GL_LINEAR) ? minFilter : GL_LINEAR;
			deUint32	wrapS		= GL_REPEAT;
			deUint32	wrapT		= GL_REPEAT;
			int			numTextures	= 1;
			bool		minify		= cases[caseNdx].minify;
			string		name		= string(cases[caseNdx].name) + (minify ? "_minify_" : "_magnify_") + texFormats[formatNdx].name;

			addChild(new Texture2DRenderCase(m_context, name.c_str(), "", format, wrapS, wrapT, minFilter, magFilter, minify ? minTransform : magTransform, numTextures, true /* pot */));
		}
	}
}